

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O2

void anova_list(reg_object *list,int N)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  
  putchar(10);
  puts("ANOVA Multiple Models : ");
  printf("%-10s%-25s%-20s%-20s%-20s \n","Model","Res.Df","RSS","Df","Sum of Sq");
  printf("%-10d%-25d%-20lf \n",(*list)->RSS,0,(ulong)(uint)(*list)->df_RSS);
  uVar3 = 1;
  while ((long)uVar3 < (long)N) {
    uVar2 = list[uVar3]->df_RSS;
    dVar1 = list[uVar3]->RSS;
    printf("%-10d%-25d%-20lf%-20d%-20lf \n",dVar1,list[uVar3 - 1]->RSS - dVar1,
           uVar3 + 1 & 0xffffffff,(ulong)uVar2,(ulong)(list[uVar3 - 1]->df_RSS - uVar2));
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void anova_list(reg_object *list, int N) {
	int i;
	printf("\n");
	printf("ANOVA Multiple Models : \n");
	printf("%-10s%-25s%-20s%-20s%-20s \n","Model", "Res.Df", "RSS", "Df", "Sum of Sq");
	printf("%-10d%-25d%-20lf \n", 0,
		list[0]->df_RSS, list[0]->RSS);
	for(i = 1; i < N;++i) {
		printf("%-10d%-25d%-20lf%-20d%-20lf \n", i+1,
		list[i]->df_RSS, list[i]->RSS, list[i-1]->df_RSS-list[i]->df_RSS,list[i-1]->RSS-list[i]->RSS);
	}
}